

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void cftmdl(int n,int l,double *a,double *w)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  long local_60;
  
  iVar6 = l * 4;
  if (0 < l) {
    uVar5 = (ulong)(uint)l;
    uVar11 = 0;
    do {
      dVar17 = a[uVar11];
      dVar18 = (a + uVar11)[1];
      dVar20 = a[uVar5 + uVar11];
      dVar23 = (a + uVar5 + uVar11)[1];
      dVar19 = dVar17 - dVar20;
      dVar21 = dVar18 - dVar23;
      dVar22 = a[uVar5 * 2 + uVar11];
      dVar24 = (a + uVar5 * 2 + uVar11)[1];
      dVar27 = a[uVar5 * 3 + uVar11];
      dVar28 = (a + uVar5 * 3 + uVar11)[1];
      dVar25 = dVar22 - dVar27;
      dVar26 = dVar24 - dVar28;
      dVar17 = dVar17 + dVar20;
      dVar18 = dVar18 + dVar23;
      dVar22 = dVar22 + dVar27;
      dVar24 = dVar24 + dVar28;
      a[uVar11] = dVar17 + dVar22;
      (a + uVar11)[1] = dVar18 + dVar24;
      a[uVar5 * 2 + uVar11] = dVar17 - dVar22;
      (a + uVar5 * 2 + uVar11)[1] = dVar18 - dVar24;
      a[uVar5 + uVar11] = dVar19 - dVar26;
      (a + uVar5 + uVar11)[1] = dVar25 + dVar21;
      a[uVar5 * 3 + uVar11] = dVar26 + dVar19;
      (a + uVar5 * 3 + uVar11)[1] = dVar21 - dVar25;
      uVar11 = uVar11 + 2;
    } while (uVar11 < uVar5);
  }
  if (iVar6 < l * 5) {
    dVar17 = w[2];
    lVar8 = (long)iVar6;
    lVar13 = (long)l;
    do {
      dVar23 = a[lVar8 + 1] - a[lVar13 + lVar8 + 1];
      dVar22 = a[lVar13 * 2 + lVar8 + 1] - a[lVar13 * 3 + lVar8 + 1];
      dVar20 = a[lVar13 * 2 + lVar8] - a[lVar13 * 3 + lVar8];
      dVar24 = a[lVar13 + lVar8 + 1] + a[lVar8 + 1];
      dVar27 = a[lVar13 * 3 + lVar8] + a[lVar13 * 2 + lVar8];
      dVar18 = a[lVar8] - a[lVar13 + lVar8];
      dVar28 = a[lVar13 * 3 + lVar8 + 1] + a[lVar13 * 2 + lVar8 + 1];
      dVar19 = a[lVar13 + lVar8] + a[lVar8];
      a[lVar8] = dVar27 + dVar19;
      (a + lVar8)[1] = dVar24 + dVar28;
      a[lVar13 * 2 + lVar8] = dVar28 - dVar24;
      (a + lVar13 * 2 + lVar8)[1] = dVar19 - dVar27;
      dVar24 = dVar18 - dVar22;
      dVar27 = dVar23 + dVar20;
      a[lVar13 + lVar8] = (dVar24 - dVar27) * dVar17;
      a[lVar13 + lVar8 + 1] = (dVar27 + dVar24) * dVar17;
      dVar18 = dVar18 + dVar22;
      dVar20 = dVar20 - dVar23;
      a[lVar13 * 3 + lVar8] = (dVar20 - dVar18) * dVar17;
      a[lVar13 * 3 + lVar8 + 1] = (dVar20 + dVar18) * dVar17;
      lVar8 = lVar8 + 2;
    } while (lVar8 < l * 5);
  }
  iVar7 = l * 8;
  if (iVar7 < n) {
    lVar13 = (long)iVar7;
    lVar16 = (long)l;
    iVar10 = l * 0xc;
    lVar15 = 0;
    lVar8 = 0;
    local_60 = lVar13;
    do {
      lVar2 = lVar8 * 2;
      dVar17 = w[lVar8 + 2];
      dVar18 = w[lVar8 + 3];
      if (0 < l) {
        dVar20 = w[lVar2 + 4];
        dVar23 = w[lVar2 + 5];
        dVar24 = (dVar18 + dVar18) * dVar20 - dVar23;
        dVar22 = dVar20 - (dVar18 + dVar18) * dVar23;
        lVar12 = lVar15;
        do {
          dVar27 = a[lVar13 + lVar12];
          dVar28 = (a + lVar13 + lVar12)[1];
          dVar19 = a[lVar16 + lVar13 + lVar12];
          dVar21 = (a + lVar16 + lVar13 + lVar12)[1];
          dVar29 = dVar27 + dVar19;
          dVar30 = dVar28 + dVar21;
          dVar25 = a[lVar16 * 2 + lVar13 + lVar12];
          dVar26 = (a + lVar16 * 2 + lVar13 + lVar12)[1];
          dVar3 = a[lVar13 + lVar16 * 3 + lVar12];
          dVar4 = (a + lVar13 + lVar16 * 3 + lVar12)[1];
          dVar31 = dVar25 + dVar3;
          dVar32 = dVar26 + dVar4;
          a[lVar13 + lVar12] = dVar29 + dVar31;
          (a + lVar13 + lVar12)[1] = dVar30 + dVar32;
          dVar29 = dVar29 - dVar31;
          dVar30 = dVar30 - dVar32;
          a[lVar16 * 2 + lVar13 + lVar12] = dVar30 * -dVar18 + dVar17 * dVar29;
          (a + lVar16 * 2 + lVar13 + lVar12)[1] = dVar29 * dVar18 + dVar17 * dVar30;
          dVar27 = dVar27 - dVar19;
          dVar28 = dVar28 - dVar21;
          dVar25 = dVar25 - dVar3;
          dVar26 = dVar26 - dVar4;
          dVar19 = dVar27 - dVar26;
          dVar21 = dVar28 - dVar25;
          dVar26 = dVar26 + dVar27;
          dVar25 = dVar25 + dVar28;
          a[lVar16 + lVar13 + lVar12] = dVar25 * -dVar23 + dVar19 * dVar20;
          (a + lVar16 + lVar13 + lVar12)[1] = dVar19 * dVar23 + dVar25 * dVar20;
          a[lVar13 + lVar16 * 3 + lVar12] = dVar21 * -dVar24 + dVar26 * dVar22;
          (a + lVar13 + lVar16 * 3 + lVar12)[1] = dVar26 * dVar24 + dVar21 * dVar22;
          lVar1 = lVar13 + lVar12;
          lVar12 = lVar12 + 2;
        } while (lVar1 + 2 < local_60 + lVar16);
      }
      if (0 < l) {
        lVar12 = (long)iVar10;
        pdVar14 = a + lVar12;
        pdVar9 = a + lVar16 + lVar12;
        dVar20 = w[lVar2 + 6];
        dVar23 = w[lVar2 + 7];
        dVar24 = (dVar17 + dVar17) * dVar20 - dVar23;
        dVar22 = dVar20 - (dVar17 + dVar17) * dVar23;
        do {
          dVar27 = *pdVar14;
          dVar28 = pdVar14[1];
          dVar19 = *pdVar9;
          dVar21 = pdVar9[1];
          dVar29 = dVar27 + dVar19;
          dVar30 = dVar28 + dVar21;
          dVar25 = pdVar14[lVar16 * 2];
          dVar26 = (pdVar14 + lVar16 * 2)[1];
          dVar3 = pdVar14[lVar16 * 3];
          dVar4 = (pdVar14 + lVar16 * 3)[1];
          dVar31 = dVar25 + dVar3;
          dVar32 = dVar26 + dVar4;
          *pdVar14 = dVar29 + dVar31;
          pdVar14[1] = dVar30 + dVar32;
          dVar29 = dVar29 - dVar31;
          dVar30 = dVar30 - dVar32;
          pdVar14[lVar16 * 2] = dVar30 * -dVar17 + -dVar18 * dVar29;
          (pdVar14 + lVar16 * 2)[1] = dVar29 * dVar17 + -dVar18 * dVar30;
          dVar27 = dVar27 - dVar19;
          dVar28 = dVar28 - dVar21;
          dVar25 = dVar25 - dVar3;
          dVar26 = dVar26 - dVar4;
          dVar19 = dVar27 - dVar26;
          dVar21 = dVar28 - dVar25;
          dVar26 = dVar26 + dVar27;
          dVar25 = dVar25 + dVar28;
          *pdVar9 = dVar25 * -dVar23 + dVar19 * dVar20;
          pdVar9[1] = dVar19 * dVar23 + dVar25 * dVar20;
          pdVar14[lVar16 * 3] = dVar21 * -dVar24 + dVar26 * dVar22;
          (pdVar14 + lVar16 * 3)[1] = dVar26 * dVar24 + dVar21 * dVar22;
          lVar12 = lVar12 + 2;
          pdVar14 = pdVar14 + 2;
          pdVar9 = pdVar9 + 2;
        } while (lVar12 < iVar6 + local_60 + lVar16);
      }
      lVar8 = lVar8 + 2;
      local_60 = local_60 + lVar13;
      iVar10 = iVar10 + iVar7;
      lVar15 = lVar15 + lVar13;
    } while (local_60 < n);
  }
  return;
}

Assistant:

void cftmdl(int n, int l, double *a, double *w)
{
    int j, j1, j2, j3, k, k1, k2, m, m2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}